

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Server::Server(Server *this)

{
  unsigned_long uVar1;
  anon_class_1_0_00000001 local_11;
  Server *local_10;
  Server *this_local;
  
  this->_vptr_Server = (_func_int **)&PTR__Server_002e03a0;
  local_10 = this;
  std::function<httplib::TaskQueue_*()>::function(&this->new_task_queue);
  this->keep_alive_max_count_ = 5;
  this->read_timeout_sec_ = 5;
  this->read_timeout_usec_ = 0;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  this->payload_max_length_ = uVar1;
  std::atomic<bool>::atomic(&this->is_running_,false);
  std::atomic<int>::atomic(&this->svr_sock_,-1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->base_dirs_);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::function
            (&this->file_request_handler_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->get_handlers_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->post_handlers_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::vector(&this->post_handlers_for_content_reader_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->put_handlers_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::vector(&this->put_handlers_for_content_reader_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->patch_handlers_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
  ::vector(&this->patch_handlers_for_content_reader_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->delete_handlers_);
  std::
  vector<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
  ::vector(&this->options_handlers_);
  std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::function
            (&this->error_handler_);
  std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::function
            (&this->logger_);
  signal(0xd,(__sighandler_t)0x1);
  std::function<httplib::TaskQueue*()>::operator=
            ((function<httplib::TaskQueue*()> *)&this->new_task_queue,&local_11);
  return;
}

Assistant:

inline Server::Server()
    : keep_alive_max_count_(CPPHTTPLIB_KEEPALIVE_MAX_COUNT),
      read_timeout_sec_(CPPHTTPLIB_READ_TIMEOUT_SECOND),
      read_timeout_usec_(CPPHTTPLIB_READ_TIMEOUT_USECOND),
      payload_max_length_(CPPHTTPLIB_PAYLOAD_MAX_LENGTH), is_running_(false),
      svr_sock_(INVALID_SOCKET) {
#ifndef _WIN32
  signal(SIGPIPE, SIG_IGN);
#endif
  new_task_queue = [] {
#if CPPHTTPLIB_THREAD_POOL_COUNT > 0
    return new ThreadPool(CPPHTTPLIB_THREAD_POOL_COUNT);
#elif CPPHTTPLIB_THREAD_POOL_COUNT == 0
    return new Threads();
#else
    return new NoThread();
#endif
  };
}